

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineno.cpp
# Opt level: O0

bool __thiscall Lineno::getNextLine(Lineno *this)

{
  istream *piVar1;
  ulong uVar2;
  bool bVar3;
  Lineno *this_local;
  
  this->lineno_ = this->lineno_ + 1;
  piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     (this->file_,(string *)&this->line_);
  uVar2 = std::ios::operator!((ios *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18)));
  bVar3 = (uVar2 & 1) == 0;
  if (bVar3) {
    std::__cxx11::string::operator+=((string *)&this->line_,'\n');
    this->pos_ = 0;
    this->start_ = 0;
    this->next_ = 1;
  }
  return bVar3;
}

Assistant:

bool Lineno::getNextLine(void) {
    // add lineno
    ++lineno_;

    // read line
    if ( ! getline(file_, line_) ) {
        // touch the EOF.
        return false;
    }
    line_ += '\n';

    // init those var: pos, the scanner pointer,
    //                 start, the first token's pos
    pos_   = 0;
    start_ = 0;
    next_  = 1;

    return true;
}